

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attached_database.cpp
# Opt level: O1

void __thiscall duckdb::AttachedDatabase::~AttachedDatabase(AttachedDatabase *this)

{
  _Head_base<0UL,_duckdb::TransactionManager_*,_false> _Var1;
  _Head_base<0UL,_duckdb::Catalog_*,_false> _Var2;
  _Head_base<0UL,_duckdb::StorageManager_*,_false> _Var3;
  
  (this->super_CatalogEntry)._vptr_CatalogEntry = (_func_int **)&PTR__AttachedDatabase_019a0f38;
  Close(this);
  _Var1._M_head_impl =
       (this->transaction_manager).
       super_unique_ptr<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::TransactionManager_*,_std::default_delete<duckdb::TransactionManager>_>
       .super__Head_base<0UL,_duckdb::TransactionManager_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (TransactionManager *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_TransactionManager + 8))();
  }
  (this->transaction_manager).
  super_unique_ptr<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::TransactionManager_*,_std::default_delete<duckdb::TransactionManager>_>
  .super__Head_base<0UL,_duckdb::TransactionManager_*,_false>._M_head_impl =
       (TransactionManager *)0x0;
  _Var2._M_head_impl =
       (this->catalog).super_unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t
       .super___uniq_ptr_impl<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Catalog_*,_std::default_delete<duckdb::Catalog>_>.
       super__Head_base<0UL,_duckdb::Catalog_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (Catalog *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_Catalog + 8))();
  }
  (this->catalog).super_unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
  super___uniq_ptr_impl<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Catalog_*,_std::default_delete<duckdb::Catalog>_>.
  super__Head_base<0UL,_duckdb::Catalog_*,_false>._M_head_impl = (Catalog *)0x0;
  _Var3._M_head_impl =
       (this->storage).
       super_unique_ptr<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>._M_t.
       super___uniq_ptr_impl<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::StorageManager_*,_std::default_delete<duckdb::StorageManager>_>
       .super__Head_base<0UL,_duckdb::StorageManager_*,_false>._M_head_impl;
  if (_Var3._M_head_impl != (StorageManager *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_StorageManager + 8))();
  }
  (this->storage).
  super_unique_ptr<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>._M_t.
  super___uniq_ptr_impl<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::StorageManager_*,_std::default_delete<duckdb::StorageManager>_>.
  super__Head_base<0UL,_duckdb::StorageManager_*,_false>._M_head_impl = (StorageManager *)0x0;
  InCatalogEntry::~InCatalogEntry((InCatalogEntry *)this);
  return;
}

Assistant:

AttachedDatabase::~AttachedDatabase() {
	Close();
}